

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

void av1_cnn_deconvolve_c
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride)

{
  PADDING_TYPE PVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  undefined4 in_register_00000014;
  int k;
  int iVar15;
  ulong uVar16;
  int l_2;
  int iVar17;
  ulong uVar18;
  int iVar19;
  undefined4 in_register_00000034;
  int iVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  int k_1;
  int iVar24;
  int iVar25;
  float fVar26;
  int out_height;
  int out_width;
  ulong local_d8;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_88;
  uint local_84;
  ulong local_80;
  undefined8 local_70;
  undefined8 local_68;
  float **local_60;
  float **local_50;
  
  local_70 = CONCAT44(in_register_00000034,in_width);
  local_68 = CONCAT44(in_register_00000014,in_height);
  local_80 = (ulong)(uint)layer_config->in_channels;
  uVar2 = layer_config->out_channels;
  uVar12 = (ulong)uVar2;
  iVar17 = uVar2 * layer_config->in_channels;
  local_84 = 0;
  local_88 = 0;
  local_60 = output;
  local_50 = input;
  av1_find_cnn_layer_output_size(in_width,in_height,layer_config,(int *)&local_84,(int *)&local_88);
  PVar1 = layer_config->pad;
  if (PVar1 == '\0') {
    if (0 < (int)uVar2) {
      local_d8 = 0;
      do {
        if (0 < (int)local_88) {
          local_b8 = 0;
          do {
            if (0 < (int)local_84) {
              pfVar3 = layer_config->bias;
              pfVar4 = local_60[local_d8];
              local_b0 = 0;
              do {
                fVar26 = pfVar3[local_d8];
                if (0 < (int)local_80) {
                  iVar22 = layer_config->filter_height;
                  uVar13 = 0;
                  do {
                    if (0 < iVar22) {
                      uVar16 = (ulong)((int)local_d8 + (int)uVar13 * uVar2);
                      iVar24 = layer_config->filter_width;
                      iVar5 = layer_config->skip_height;
                      uVar9 = iVar22 - iVar5;
                      iVar8 = 0;
                      if ((int)uVar9 < 1) {
                        uVar9 = 0;
                      }
                      do {
                        if (0 < iVar24) {
                          iVar6 = ((int)local_b8 - iVar8) + (uVar9 >> 1);
                          iVar20 = layer_config->skip_width;
                          uVar10 = iVar24 - iVar20;
                          if ((int)uVar10 < 1) {
                            uVar10 = 0;
                          }
                          iVar19 = iVar6 / iVar5;
                          uVar16 = (ulong)(int)uVar16;
                          iVar11 = (uVar10 >> 1) + (int)local_b0;
                          iVar15 = iVar24;
                          do {
                            if ((((iVar6 % iVar5 == 0) &&
                                 (iVar7 = iVar11 / iVar20, iVar11 % iVar20 == 0)) && (-1 < iVar19))
                               && (((iVar19 < (int)local_68 && (-1 < iVar7)) &&
                                   (iVar7 < (int)local_70)))) {
                              fVar26 = fVar26 + layer_config->weights[uVar16] *
                                                local_50[uVar13][iVar19 * in_stride + iVar7];
                            }
                            uVar16 = uVar16 + (long)iVar17;
                            iVar11 = iVar11 + -1;
                            iVar15 = iVar15 + -1;
                          } while (iVar15 != 0);
                        }
                        iVar8 = iVar8 + 1;
                      } while (iVar8 != iVar22);
                    }
                    uVar13 = uVar13 + 1;
                  } while (uVar13 != local_80);
                }
                pfVar4[local_b8 * (long)out_stride + local_b0] = fVar26;
                local_b0 = local_b0 + 1;
              } while (local_b0 != local_84);
            }
            local_b8 = local_b8 + 1;
          } while (local_b8 != local_88);
        }
        local_d8 = local_d8 + 1;
      } while (local_d8 != uVar12);
    }
  }
  else if (PVar1 == '\x01') {
    if (0 < (int)uVar2) {
      local_a0 = 0;
      do {
        if (0 < (int)local_88) {
          local_c0 = 0;
          do {
            if (0 < (int)local_84) {
              pfVar3 = layer_config->bias;
              pfVar4 = local_60[local_a0];
              local_d8 = 0;
              do {
                fVar26 = pfVar3[local_a0];
                if (0 < (int)local_80) {
                  iVar22 = layer_config->filter_height;
                  uVar13 = 0;
                  do {
                    if (0 < iVar22) {
                      uVar16 = (ulong)((int)local_a0 + (int)uVar13 * uVar2);
                      iVar24 = layer_config->filter_width;
                      iVar5 = layer_config->skip_height;
                      uVar9 = iVar22 - iVar5;
                      iVar8 = 0;
                      if ((int)uVar9 < 1) {
                        uVar9 = 0;
                      }
                      do {
                        if (0 < iVar24) {
                          iVar6 = ((int)local_c0 - iVar8) + (uVar9 >> 1);
                          iVar20 = layer_config->skip_width;
                          uVar10 = iVar24 - iVar20;
                          if ((int)uVar10 < 1) {
                            uVar10 = 0;
                          }
                          iVar19 = iVar6 / iVar5;
                          uVar16 = (ulong)(int)uVar16;
                          iVar11 = (uVar10 >> 1) + (int)local_d8;
                          iVar15 = iVar24;
                          do {
                            if ((iVar6 % iVar5 == 0) &&
                               (iVar7 = iVar11 / iVar20, iVar11 % iVar20 == 0)) {
                              iVar14 = (int)local_68 + -1;
                              if (iVar19 < (int)local_68) {
                                iVar14 = iVar19;
                              }
                              if (iVar19 < 0) {
                                iVar14 = 0;
                              }
                              iVar25 = iVar7;
                              if ((int)local_70 <= iVar7) {
                                iVar25 = (int)local_70 + -1;
                              }
                              iVar23 = 0;
                              if (-1 < iVar7) {
                                iVar23 = iVar25;
                              }
                              fVar26 = fVar26 + layer_config->weights[uVar16] *
                                                local_50[uVar13][iVar14 * in_stride + iVar23];
                            }
                            uVar16 = uVar16 + (long)iVar17;
                            iVar11 = iVar11 + -1;
                            iVar15 = iVar15 + -1;
                          } while (iVar15 != 0);
                        }
                        iVar8 = iVar8 + 1;
                      } while (iVar8 != iVar22);
                    }
                    uVar13 = uVar13 + 1;
                  } while (uVar13 != local_80);
                }
                pfVar4[local_c0 * (long)out_stride + local_d8] = fVar26;
                local_d8 = local_d8 + 1;
              } while (local_d8 != local_84);
            }
            local_c0 = local_c0 + 1;
          } while (local_c0 != local_88);
        }
        local_a0 = local_a0 + 1;
      } while (local_a0 != uVar12);
    }
  }
  else if ((PVar1 == '\x02') && (0 < (int)uVar2)) {
    local_c8 = 0;
    do {
      if (0 < (int)local_88) {
        local_a8 = 0;
        do {
          if (0 < (int)local_84) {
            pfVar3 = layer_config->bias;
            pfVar4 = local_60[local_c8];
            uVar13 = 0;
            do {
              fVar26 = pfVar3[local_c8];
              if (0 < (int)local_80) {
                uVar16 = 0;
                do {
                  if (0 < layer_config->filter_height) {
                    uVar18 = (ulong)((int)local_c8 + (int)uVar16 * uVar2);
                    iVar22 = 0;
                    do {
                      if (0 < layer_config->filter_width) {
                        iVar5 = (int)local_a8 - iVar22;
                        iVar8 = iVar5 / layer_config->skip_height;
                        uVar18 = (ulong)(int)uVar18;
                        uVar21 = uVar13 & 0xffffffff;
                        iVar24 = layer_config->filter_width;
                        do {
                          iVar20 = (int)uVar21;
                          if (((((iVar5 % layer_config->skip_height == 0) &&
                                (iVar6 = iVar20 / layer_config->skip_width,
                                iVar20 % layer_config->skip_width == 0)) && (-1 < iVar8)) &&
                              ((iVar8 < (int)local_68 && (-1 < iVar6)))) && (iVar6 < (int)local_70))
                          {
                            fVar26 = fVar26 + layer_config->weights[uVar18] *
                                              local_50[uVar16][iVar8 * in_stride + iVar6];
                          }
                          uVar18 = uVar18 + (long)iVar17;
                          uVar21 = (ulong)(iVar20 - 1);
                          iVar24 = iVar24 + -1;
                        } while (iVar24 != 0);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != layer_config->filter_height);
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar16 != local_80);
              }
              pfVar4[local_a8 * (long)out_stride + uVar13] = fVar26;
              uVar13 = uVar13 + 1;
            } while (uVar13 != local_84);
          }
          local_a8 = local_a8 + 1;
        } while (local_a8 != local_88);
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 != uVar12);
  }
  return;
}

Assistant:

void av1_cnn_deconvolve_c(const float **input, int in_width, int in_height,
                          int in_stride, const CNN_LAYER_CONFIG *layer_config,
                          float **output, int out_stride) {
  assert(layer_config->deconvolve);

  const int cstep = layer_config->in_channels * layer_config->out_channels;

  int out_width = 0;
  int out_height = 0;
  av1_find_cnn_layer_output_size(in_width, in_height, layer_config, &out_width,
                                 &out_height);
  switch (layer_config->pad) {
    case PADDING_SAME_ZERO:
      for (int i = 0; i < layer_config->out_channels; ++i) {
        for (int u = 0; u < out_height; ++u) {
          for (int v = 0; v < out_width; ++v) {
            float sum = layer_config->bias[i];
            for (int k = 0; k < layer_config->in_channels; ++k) {
              int off = k * layer_config->out_channels + i;
              for (int l = 0; l < layer_config->filter_height; ++l) {
                const int h =
                    u - l +
                    get_start_shift_deconvolve(layer_config->filter_height,
                                               layer_config->skip_height);
                for (int m = 0; m < layer_config->filter_width;
                     ++m, off += cstep) {
                  const int w =
                      v - m +
                      get_start_shift_deconvolve(layer_config->filter_width,
                                                 layer_config->skip_width);
                  if ((h % layer_config->skip_height) != 0 ||
                      (w % layer_config->skip_width) != 0)
                    continue;
                  const int ii = h / layer_config->skip_height;
                  const int jj = w / layer_config->skip_width;
                  if (ii < 0 || ii >= in_height || jj < 0 || jj >= in_width)
                    continue;
                  sum += layer_config->weights[off] *
                         input[k][ii * in_stride + jj];
                }
              }
            }
            output[i][u * out_stride + v] = sum;
          }
        }
      }
      break;
    case PADDING_SAME_REPLICATE:
      for (int i = 0; i < layer_config->out_channels; ++i) {
        for (int u = 0; u < out_height; ++u) {
          for (int v = 0; v < out_width; ++v) {
            float sum = layer_config->bias[i];
            for (int k = 0; k < layer_config->in_channels; ++k) {
              int off = k * layer_config->out_channels + i;
              for (int l = 0; l < layer_config->filter_height; ++l) {
                const int h =
                    u - l +
                    get_start_shift_deconvolve(layer_config->filter_height,
                                               layer_config->skip_height);
                for (int m = 0; m < layer_config->filter_width;
                     ++m, off += cstep) {
                  const int w =
                      v - m +
                      get_start_shift_deconvolve(layer_config->filter_width,
                                                 layer_config->skip_width);
                  if ((h % layer_config->skip_height) != 0 ||
                      (w % layer_config->skip_width) != 0)
                    continue;
                  const int ii =
                      CLAMPINDEX(h / layer_config->skip_height, in_height);
                  const int jj =
                      CLAMPINDEX(w / layer_config->skip_width, in_width);
                  assert(ii >= 0 && ii < in_height && jj >= 0 && jj < in_width);
                  sum += layer_config->weights[off] *
                         input[k][ii * in_stride + jj];
                }
              }
            }
            output[i][u * out_stride + v] = sum;
          }
        }
      }
      break;
    case PADDING_VALID:
      for (int i = 0; i < layer_config->out_channels; ++i) {
        for (int u = 0; u < out_height; ++u) {
          for (int v = 0; v < out_width; ++v) {
            float sum = layer_config->bias[i];
            for (int k = 0; k < layer_config->in_channels; ++k) {
              int off = k * layer_config->out_channels + i;
              for (int l = 0; l < layer_config->filter_height; ++l) {
                const int h = u - l;
                for (int m = 0; m < layer_config->filter_width;
                     ++m, off += cstep) {
                  const int w = v - m;
                  if ((h % layer_config->skip_height) != 0 ||
                      (w % layer_config->skip_width) != 0)
                    continue;
                  const int ii = h / layer_config->skip_height;
                  const int jj = w / layer_config->skip_width;
                  if (ii < 0 || ii >= in_height || jj < 0 || jj >= in_width)
                    continue;
                  sum += layer_config->weights[off] *
                         input[k][ii * in_stride + jj];
                }
              }
            }
            output[i][u * out_stride + v] = sum;
          }
        }
      }
      break;
    default: assert(0 && "Unknown padding type");
  }
}